

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddIte.c
# Opt level: O2

DdNode * cuddBddIntersectRecur(DdManager *dd,DdNode *f,DdNode *g)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  DdNode *pDVar5;
  uint *puVar6;
  DdNode *pDVar7;
  uint *puVar8;
  uint index;
  DdNode *pDVar9;
  DdNode *g_00;
  DdNode *pDVar10;
  DdNode *E;
  
  pDVar10 = dd->one;
  E = (DdNode *)((ulong)pDVar10 ^ 1);
  if (E == g || E == f) {
    return E;
  }
  if ((DdNode *)((ulong)g ^ 1) == f) {
    return E;
  }
  if (pDVar10 == g || f == g) {
    return f;
  }
  if (pDVar10 == f) {
    return g;
  }
  pDVar10 = f;
  if ((long)((ulong)((uint)g & 1) + *(long *)(((ulong)g & 0xfffffffffffffffe) + 0x20) * 2) <
      (long)((ulong)((uint)f & 1) + *(long *)(((ulong)f & 0xfffffffffffffffe) + 0x20) * 2)) {
    pDVar10 = g;
    g = f;
  }
  pDVar5 = cuddCacheLookup2(dd,Cudd_bddIntersect,pDVar10,g);
  if (pDVar5 != (DdNode *)0x0) {
    return pDVar5;
  }
  puVar8 = (uint *)((ulong)pDVar10 & 0xfffffffffffffffe);
  uVar2 = *puVar8;
  uVar3 = dd->perm[uVar2];
  puVar6 = (uint *)((ulong)g & 0xfffffffffffffffe);
  uVar4 = dd->perm[*puVar6];
  pDVar5 = pDVar10;
  pDVar9 = pDVar10;
  index = *puVar6;
  if (uVar3 <= uVar4) {
    pDVar5 = *(DdNode **)(puVar8 + 4);
    pDVar9 = *(DdNode **)(puVar8 + 6);
    index = uVar2;
    if (((ulong)pDVar10 & 1) != 0) {
      pDVar5 = (DdNode *)((ulong)pDVar5 ^ 1);
      pDVar9 = (DdNode *)((ulong)pDVar9 ^ 1);
    }
  }
  pDVar7 = g;
  g_00 = g;
  if (uVar4 <= uVar3) {
    pDVar7 = *(DdNode **)(puVar6 + 4);
    g_00 = *(DdNode **)(puVar6 + 6);
    if (((ulong)g & 1) != 0) {
      pDVar7 = (DdNode *)((ulong)pDVar7 ^ 1);
      g_00 = (DdNode *)((ulong)g_00 ^ 1);
    }
  }
  pDVar5 = cuddBddIntersectRecur(dd,pDVar5,pDVar7);
  if (pDVar5 != (DdNode *)0x0) {
    pDVar7 = (DdNode *)((ulong)pDVar5 & 0xfffffffffffffffe);
    pDVar7->ref = pDVar7->ref + 1;
    if ((pDVar5 != E) || (E = cuddBddIntersectRecur(dd,pDVar9,g_00), E != (DdNode *)0x0)) {
      piVar1 = (int *)(((ulong)E & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      pDVar9 = pDVar5;
      if (pDVar5 == E) {
LAB_00663e27:
        piVar1 = (int *)(((ulong)E & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        pDVar7->ref = pDVar7->ref - 1;
        cuddCacheInsert2(dd,Cudd_bddIntersect,pDVar10,g,pDVar9);
        return pDVar9;
      }
      if (((ulong)pDVar5 & 1) == 0) {
        pDVar9 = cuddUniqueInter(dd,index,pDVar5,E);
        if (pDVar9 != (DdNode *)0x0) goto LAB_00663e27;
      }
      else {
        pDVar9 = cuddUniqueInter(dd,index,pDVar7,(DdNode *)((ulong)E ^ 1));
        if (pDVar9 != (DdNode *)0x0) {
          pDVar9 = (DdNode *)((ulong)pDVar9 ^ 1);
          goto LAB_00663e27;
        }
      }
      Cudd_IterDerefBdd(dd,pDVar5);
      pDVar5 = E;
    }
    Cudd_IterDerefBdd(dd,pDVar5);
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddBddIntersectRecur(
  DdManager * dd,
  DdNode * f,
  DdNode * g)
{
    DdNode *res;
    DdNode *F, *G, *t, *e;
    DdNode *fv, *fnv, *gv, *gnv;
    DdNode *one, *zero;
    unsigned int index, topf, topg;

    statLine(dd);
    one = DD_ONE(dd);
    zero = Cudd_Not(one);

    /* Terminal cases. */
    if (f == zero || g == zero || f == Cudd_Not(g)) return(zero);
    if (f == g || g == one) return(f);
    if (f == one) return(g);

    /* At this point f and g are not constant. */
    if (cuddF2L(f) > cuddF2L(g)) { DdNode *tmp = f; f = g; g = tmp; }
    res = cuddCacheLookup2(dd,Cudd_bddIntersect,f,g);
    if (res != NULL) return(res);

    /* Find splitting variable. Here we can skip the use of cuddI,
    ** because the operands are known to be non-constant.
    */
    F = Cudd_Regular(f);
    topf = dd->perm[F->index];
    G = Cudd_Regular(g);
    topg = dd->perm[G->index];

    /* Compute cofactors. */
    if (topf <= topg) {
        index = F->index;
        fv = cuddT(F);
        fnv = cuddE(F);
        if (Cudd_IsComplement(f)) {
            fv = Cudd_Not(fv);
            fnv = Cudd_Not(fnv);
        }
    } else {
        index = G->index;
        fv = fnv = f;
    }

    if (topg <= topf) {
        gv = cuddT(G);
        gnv = cuddE(G);
        if (Cudd_IsComplement(g)) {
            gv = Cudd_Not(gv);
            gnv = Cudd_Not(gnv);
        }
    } else {
        gv = gnv = g;
    }

    /* Compute partial results. */
    t = cuddBddIntersectRecur(dd,fv,gv);
    if (t == NULL) return(NULL);
    cuddRef(t);
    if (t != zero) {
        e = zero;
    } else {
        e = cuddBddIntersectRecur(dd,fnv,gnv);
        if (e == NULL) {
            Cudd_IterDerefBdd(dd, t);
            return(NULL);
        }
    }
    cuddRef(e);

    if (t == e) { /* both equal zero */
        res = t;
    } else if (Cudd_IsComplement(t)) {
        res = cuddUniqueInter(dd,(int)index,Cudd_Not(t),Cudd_Not(e));
        if (res == NULL) {
            Cudd_IterDerefBdd(dd, t);
            Cudd_IterDerefBdd(dd, e);
            return(NULL);
        }
        res = Cudd_Not(res);
    } else {
        res = cuddUniqueInter(dd,(int)index,t,e);
        if (res == NULL) {
            Cudd_IterDerefBdd(dd, t);
            Cudd_IterDerefBdd(dd, e);
            return(NULL);
        }
    }
    cuddDeref(e);
    cuddDeref(t);

    cuddCacheInsert2(dd,Cudd_bddIntersect,f,g,res);

    return(res);

}